

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parsed_expression.cpp
# Opt level: O3

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::ParameterExpression::Deserialize(ParameterExpression *this,Deserializer *deserializer)

{
  uint uVar1;
  ParameterExpression *this_00;
  pointer pPVar2;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::ParameterExpression_*,_false> local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  this_00 = (ParameterExpression *)operator_new(0x58);
  ParameterExpression(this_00);
  local_58._M_head_impl = this_00;
  pPVar2 = unique_ptr<duckdb::ParameterExpression,_std::default_delete<duckdb::ParameterExpression>,_true>
           ::operator->((unique_ptr<duckdb::ParameterExpression,_std::default_delete<duckdb::ParameterExpression>,_true>
                         *)&local_58);
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"identifier");
  if ((char)uVar1 == '\0') {
    local_48 = 0;
    local_40[0] = 0;
    local_50 = local_40;
    ::std::__cxx11::string::operator=((string *)&pPVar2->identifier,(string *)&local_50);
    if (local_50 == local_40) goto LAB_010a1943;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&pPVar2->identifier,(string *)&local_50);
    if (local_50 == local_40) goto LAB_010a1943;
  }
  operator_delete(local_50);
LAB_010a1943:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar1 & 0xff));
  (this->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)local_58._M_head_impl;
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> ParameterExpression::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<ParameterExpression>(new ParameterExpression());
	deserializer.ReadPropertyWithDefault<string>(200, "identifier", result->identifier);
	return std::move(result);
}